

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::type_string(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
              *this,string *string)

{
  _Alloc_hider __p;
  _Alloc_hider local_18;
  
  std::make_unique<Utility::StringSerialiser,std::__cxx11::string_const&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8,(bool *)string);
  __p._M_p = local_18._M_p;
  local_18._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  reset((__uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
         *)&this->string_serialiser_,(pointer)__p._M_p);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  ~unique_ptr((unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
               *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void type_string(const std::string &string) final {
			string_serialiser_ = std::make_unique<Utility::StringSerialiser>(string, true);
		}